

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFAcceleratorTable.cpp
# Opt level: O1

Optional<llvm::DWARFFormValue> * __thiscall
llvm::AppleAcceleratorTable::Entry::lookup
          (Optional<llvm::DWARFFormValue> *__return_storage_ptr__,Entry *this,AtomType Atom)

{
  AtomType *pAVar1;
  uint uVar2;
  HeaderData *pHVar3;
  AtomType *pAVar4;
  undefined8 uVar5;
  anon_union_8_3_82d75f4a_for_ValueType_0 aVar6;
  uint8_t *puVar7;
  uint64_t uVar8;
  DWARFContext *pDVar9;
  undefined8 *puVar10;
  long lVar11;
  bool bVar12;
  
  pHVar3 = this->HdrData;
  if (pHVar3 == (HeaderData *)0x0) {
    __assert_fail("HdrData && \"Dereferencing end iterator?\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/third_party/llvm-project/DWARFAcceleratorTable.cpp"
                  ,0x116,
                  "Optional<DWARFFormValue> llvm::AppleAcceleratorTable::Entry::lookup(HeaderData::AtomType) const"
                 );
  }
  uVar2 = (pHVar3->Atoms).super_SmallVectorImpl<std::pair<unsigned_short,_llvm::dwarf::Form>_>.
          super_SmallVectorTemplateBase<std::pair<unsigned_short,_llvm::dwarf::Form>,_false>.
          super_SmallVectorTemplateCommon<std::pair<unsigned_short,_llvm::dwarf::Form>,_void>.
          super_SmallVectorBase.Size;
  if (uVar2 != (this->super_Entry).Values.super_SmallVectorImpl<llvm::DWARFFormValue>.
               super_SmallVectorTemplateBase<llvm::DWARFFormValue,_true>.
               super_SmallVectorTemplateCommon<llvm::DWARFFormValue,_void>.super_SmallVectorBase.
               Size) {
    __assert_fail("HdrData->Atoms.size() == Values.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/third_party/llvm-project/DWARFAcceleratorTable.cpp"
                  ,0x117,
                  "Optional<DWARFFormValue> llvm::AppleAcceleratorTable::Entry::lookup(HeaderData::AtomType) const"
                 );
  }
  bVar12 = (ulong)uVar2 == 0;
  if (!bVar12) {
    pAVar4 = (AtomType *)
             (pHVar3->Atoms).super_SmallVectorImpl<std::pair<unsigned_short,_llvm::dwarf::Form>_>.
             super_SmallVectorTemplateBase<std::pair<unsigned_short,_llvm::dwarf::Form>,_false>.
             super_SmallVectorTemplateCommon<std::pair<unsigned_short,_llvm::dwarf::Form>,_void>.
             super_SmallVectorBase.BeginX;
    puVar10 = (undefined8 *)
              (this->super_Entry).Values.super_SmallVectorImpl<llvm::DWARFFormValue>.
              super_SmallVectorTemplateBase<llvm::DWARFFormValue,_true>.
              super_SmallVectorTemplateCommon<llvm::DWARFFormValue,_void>.super_SmallVectorBase.
              BeginX;
    if (*pAVar4 != Atom) {
      lVar11 = 4;
      do {
        bVar12 = (ulong)uVar2 << 2 == lVar11;
        if (bVar12) goto LAB_00ae3974;
        puVar10 = puVar10 + 6;
        pAVar1 = (AtomType *)((long)pAVar4 + lVar11);
        lVar11 = lVar11 + 4;
      } while (*pAVar1 != Atom);
    }
    uVar5 = *puVar10;
    aVar6 = *(anon_union_8_3_82d75f4a_for_ValueType_0 *)(puVar10 + 1);
    puVar7 = (uint8_t *)puVar10[2];
    uVar8 = puVar10[3];
    pDVar9 = (DWARFContext *)puVar10[5];
    (__return_storage_ptr__->Storage).field_0.value.U = (DWARFUnit *)puVar10[4];
    (__return_storage_ptr__->Storage).field_0.value.C = pDVar9;
    (__return_storage_ptr__->Storage).field_0.value.Value.data = puVar7;
    (__return_storage_ptr__->Storage).field_0.value.Value.SectionIndex = uVar8;
    *(undefined8 *)&(__return_storage_ptr__->Storage).field_0 = uVar5;
    (__return_storage_ptr__->Storage).field_0.value.Value.field_0 = aVar6;
    (__return_storage_ptr__->Storage).hasVal = true;
    if (!bVar12) {
      return __return_storage_ptr__;
    }
  }
LAB_00ae3974:
  (__return_storage_ptr__->Storage).field_0.empty = '\0';
  (__return_storage_ptr__->Storage).hasVal = false;
  return __return_storage_ptr__;
}

Assistant:

Optional<DWARFFormValue>
AppleAcceleratorTable::Entry::lookup(HeaderData::AtomType Atom) const {
  assert(HdrData && "Dereferencing end iterator?");
  assert(HdrData->Atoms.size() == Values.size());
  for (const auto &Tuple : zip_first(HdrData->Atoms, Values)) {
    if (std::get<0>(Tuple).first == Atom)
      return std::get<1>(Tuple);
  }
  return None;
}